

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O2

void __thiscall
pfederc::Parser::parseCapabilityDirective
          (Parser *this,bool *isunused,bool *isinline,bool *isconstant)

{
  Token *pTVar1;
  bool bVar2;
  undefined1 local_70 [16];
  string str;
  undefined1 local_40 [16];
  
  sanityExpect(this,TOK_DIRECTIVE);
  pTVar1 = this->lexer->currentToken;
  bVar2 = expect(this,TOK_ID);
  if (bVar2) {
    (*pTVar1->_vptr_Token[2])(&str,pTVar1,this->lexer);
    bVar2 = std::operator==(&str,"Unused");
    if ((bVar2) && (*isunused == false)) {
      *isunused = true;
    }
    else {
      bVar2 = std::operator==(&str,"Inline");
      if ((bVar2) && (*isinline == false)) {
        *isinline = true;
      }
      else {
        bVar2 = std::operator==(&str,"Constant");
        if ((bVar2) && (*isconstant == false)) {
          *isconstant = true;
        }
        else {
          local_70._6_2_ = 2;
          local_70._0_4_ = STX_ERR_INVALID_CAPS_DIRECTIVE;
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                    ((Level *)(local_70 + 8),(SyntaxErrorCode *)(local_70 + 6),(Position *)local_70)
          ;
          generateError((Parser *)local_40,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     local_40);
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)(local_70 + 8));
        }
      }
    }
    std::__cxx11::string::~string((string *)&str);
  }
  else {
    local_70._0_2_ = 2;
    local_70._8_4_ = 0x28;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&str,(SyntaxErrorCode *)local_70,(Position *)(local_70 + 8));
    generateError((Parser *)(local_40 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_40 + 8));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&str);
  }
  return;
}

Assistant:

void Parser::parseCapabilityDirective(bool &isunused, bool &isinline, bool &isconstant) noexcept {
  sanityExpect(TokenType::TOK_DIRECTIVE);

  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_DIRECTIVE,
          lexer.getCurrentToken()->getPosition()));
    return;
  }

  std::string str = tokId->toString(getLexer());
  if (str == "Unused" && !isunused) {
    isunused = true;
  } else if (str == "Inline" && !isinline) {
    isinline = true;
  } else if (str == "Constant" && !isconstant) {
    isconstant = true;
  } else {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_DIRECTIVE,
          lexer.getCurrentToken()->getPosition()));
  }
}